

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O1

Oop __thiscall
Lodtalk::MethodSemanticAnalysis::visitBlockExpression
          (MethodSemanticAnalysis *this,BlockExpression *node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer ppAVar1;
  pointer ppAVar2;
  pointer psVar3;
  element_type *peVar4;
  int iVar5;
  undefined4 extraout_var;
  vector<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_> *pvVar6;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var7;
  Oop localContext;
  Oop OVar8;
  SequenceNode *pSVar9;
  anon_union_8_4_0eb573b0_for_Oop_0 location;
  LocalScope *this_02;
  long lVar10;
  anon_union_8_4_0eb573b0_for_Oop_0 symbol;
  long lVar11;
  Node *pNVar12;
  LocalVariables oldLocalVariables;
  TemporalVariableLookupPtr res_1;
  undefined1 local_88 [32];
  Node *local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  anon_union_8_4_0eb573b0_for_Oop_0 local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  anon_union_8_4_0eb573b0_for_Oop_0 local_40;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  ArgumentList *this_01;
  
  iVar5 = (*(node->super_FunctionalNode).super_Node._vptr_Node[8])(node);
  this_01 = (ArgumentList *)CONCAT44(extraout_var,iVar5);
  iVar5 = (*(node->super_FunctionalNode).super_Node._vptr_Node[9])(node);
  if ((char)iVar5 == '\0') {
    pNVar12 = this->localContext;
    this->localContext = (Node *)node;
    local_88._0_8_ =
         (this->localVariables).
         super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    local_88._8_8_ =
         (this->localVariables).
         super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_88._16_8_ =
         (this->localVariables).
         super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (this_01 != (ArgumentList *)0x0) {
      pvVar6 = AST::ArgumentList::getArguments(this_01);
      ppAVar1 = (pvVar6->
                super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                )._M_impl.super__Vector_impl_data._M_start;
      ppAVar2 = (pvVar6->
                super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                )._M_impl.super__Vector_impl_data._M_finish;
      local_88._24_8_ = this_01;
      local_68 = pNVar12;
      p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
      p_Var7->_M_use_count = 1;
      p_Var7->_M_weak_count = 1;
      p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164d68;
      symbol.pointer = (uint8_t *)(p_Var7 + 1);
      LocalScope::LocalScope
                ((LocalScope *)symbol.header,&(this->super_ScopedInterpreter).currentScope);
      if (ppAVar2 != ppAVar1) {
        lVar10 = (long)ppAVar2 - (long)ppAVar1 >> 3;
        lVar11 = 0;
        do {
          OVar8 = AST::Argument::getSymbolOop
                            ((pvVar6->
                             super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                             )._M_impl.super__Vector_impl_data._M_start[lVar11]);
          location.pointer = symbol.pointer;
          this_02 = (LocalScope *)&local_60;
          LocalScope::addArgument((LocalScope *)&local_60,(Oop)symbol,(Node *)OVar8.field_0);
          if (local_60 == (_Base_ptr)0x0) goto LAB_001372e0;
          std::
          vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
          ::push_back(&this->localVariables,(value_type *)&local_60);
          if (local_58 != (_Base_ptr)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58);
          }
          lVar11 = lVar11 + 1;
        } while (lVar10 + (ulong)(lVar10 == 0) != lVar11);
      }
      pNVar12 = local_68;
      this_01 = (ArgumentList *)local_88._24_8_;
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      }
      (this->super_ScopedInterpreter).currentScope.
      super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)symbol;
      local_50.pointer = symbol.pointer;
      local_48._M_pi = p_Var7;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->super_ScopedInterpreter).currentScope.
                  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,&local_48);
      if (local_48._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48._M_pi);
      }
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    }
    pSVar9 = AST::BlockExpression::getBody(node);
    (*(pSVar9->super_Node)._vptr_Node[2])(pSVar9,this);
    if (this_01 != (ArgumentList *)0x0) {
      peVar4 = (this->super_ScopedInterpreter).currentScope.
               super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      (this->super_ScopedInterpreter).currentScope.
      super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (peVar4->parentScope).
           super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->super_ScopedInterpreter).currentScope.
                  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount,
                 &(peVar4->parentScope).
                  super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    AST::FunctionalNode::setLocalVariables(&node->super_FunctionalNode,&this->localVariables);
    this->localContext = pNVar12;
    psVar3 = (this->localVariables).
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    peVar4 = (element_type *)
             (this->localVariables).
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (this->localVariables).
             super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)local_88._0_8_;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_88._8_8_;
    (this->localVariables).
    super__Vector_base<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_88._16_8_;
    local_88._0_8_ = psVar3;
    local_88._8_8_ = peVar4;
    local_88._16_8_ = p_Var7;
    std::
    vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
    ::~vector((vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
               *)local_88);
  }
  else if (this_01 == (ArgumentList *)0x0) {
    pSVar9 = AST::BlockExpression::getBody(node);
    (*(pSVar9->super_Node)._vptr_Node[2])(pSVar9,this);
  }
  else {
    pvVar6 = AST::ArgumentList::getArguments(this_01);
    ppAVar1 = (pvVar6->
              super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
              )._M_impl.super__Vector_impl_data._M_start;
    ppAVar2 = (pvVar6->
              super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
              )._M_impl.super__Vector_impl_data._M_finish;
    p_Var7 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x58);
    p_Var7->_M_use_count = 1;
    p_Var7->_M_weak_count = 1;
    p_Var7->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_00164d68;
    OVar8.field_0 = (anon_union_8_4_0eb573b0_for_Oop_0)(p_Var7 + 1);
    LocalScope::LocalScope
              ((LocalScope *)OVar8.field_0,&(this->super_ScopedInterpreter).currentScope);
    lVar11 = (long)ppAVar2 - (long)ppAVar1;
    if (lVar11 != 0) {
      lVar11 = lVar11 >> 3;
      lVar10 = 0;
      do {
        localContext = AST::Argument::getSymbolOop
                                 ((pvVar6->
                                  super__Vector_base<Lodtalk::AST::Argument_*,_std::allocator<Lodtalk::AST::Argument_*>_>
                                  )._M_impl.super__Vector_impl_data._M_start[lVar10]);
        location = OVar8.field_0;
        this_02 = (LocalScope *)local_88;
        LocalScope::addArgument((LocalScope *)local_88,OVar8,(Node *)localContext.field_0);
        if ((pointer)local_88._0_8_ == (pointer)0x0) {
LAB_001372e0:
          AbstractASTVisitor::error
                    ((AbstractASTVisitor *)this_02,(Node *)location.header,
                     "the argument has the same name as another argument.");
        }
        AST::BlockExpression::addInlineArgument(node,(TemporalVariableLookupPtr *)local_88);
        std::
        vector<std::shared_ptr<Lodtalk::TemporalVariableLookup>,_std::allocator<std::shared_ptr<Lodtalk::TemporalVariableLookup>_>_>
        ::push_back(&this->localVariables,(value_type *)local_88);
        if ((element_type *)local_88._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._8_8_);
        }
        lVar10 = lVar10 + 1;
      } while (lVar11 + (ulong)(lVar11 == 0) != lVar10);
    }
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var7->_M_use_count = p_Var7->_M_use_count + 1;
    }
    (this->super_ScopedInterpreter).currentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)OVar8.field_0;
    this_00 = &(this->super_ScopedInterpreter).currentScope.
               super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    local_40 = OVar8.field_0;
    local_38._M_pi = p_Var7;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(this_00,&local_38);
    if (local_38._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38._M_pi);
    }
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var7);
    pSVar9 = AST::BlockExpression::getBody(node);
    (*(pSVar9->super_Node)._vptr_Node[2])(pSVar9,this);
    peVar4 = (this->super_ScopedInterpreter).currentScope.
             super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_ScopedInterpreter).currentScope.
    super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (peVar4->parentScope).
         super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (this_00,&(peVar4->parentScope).
                        super___shared_ptr<Lodtalk::EvaluationScope,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount);
  }
  return (Oop)&NilObject;
}

Assistant:

Oop MethodSemanticAnalysis::visitBlockExpression(BlockExpression *node)
{
    auto argumentList = node->getArgumentList();

    if(node->isInlined())
    {
        if(argumentList)
        {
            auto &arguments = argumentList->getArguments();
            auto argumentCount = arguments.size();

            // Create the arguments scope.
            auto argumentScope = std::make_shared<LocalScope> (currentScope);
            for(size_t i = 0; i < argumentCount; ++i)
            {
                auto &arg = arguments[i];
                auto res = argumentScope->addArgument(arg->getSymbolOop(), localContext);
                if(!res)
                    error(arg, "the argument has the same name as another argument.");
                node->addInlineArgument(res);
                localVariables.push_back(res);
            }

            pushScope(argumentScope);
        }

        // Visit the method body
        node->getBody()->acceptVisitor(this);

        if(argumentList)
            popScope();
        return Oop();
    }

    // Store the local context.
    auto oldLocalContext = localContext;
    localContext = node;
    FunctionalNode::LocalVariables oldLocalVariables;
    oldLocalVariables.swap(localVariables);

    // Process the arguments
	if(argumentList)
	{
		auto &arguments = argumentList->getArguments();
        auto argumentCount = arguments.size();

		// Create the arguments scope.
		auto argumentScope = std::make_shared<LocalScope> (currentScope);
		for(size_t i = 0; i < argumentCount; ++i)
		{
			auto &arg = arguments[i];
			auto res = argumentScope->addArgument(arg->getSymbolOop(), localContext);
			if(!res)
				error(arg, "the argument has the same name as another argument.");
            localVariables.push_back(res);
		}

		pushScope(argumentScope);
	}

    // Visit the method body
	node->getBody()->acceptVisitor(this);

	if(argumentList)
		popScope();

    // Store the block local variables.
    node->setLocalVariables(localVariables);

    // Restore the local context.
    localContext = oldLocalContext;
    oldLocalVariables.swap(localVariables);

    return Oop();
}